

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O0

transformation_t * opengv::math::arun_complete(points_t *p1,points_t *p2)

{
  size_type sVar1;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar2;
  TransposeReturnType other;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDX;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  PVar3;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar4;
  translation_t translation;
  rotation_t rotation;
  Vector3d fprime;
  Vector3d f;
  size_t i_1;
  MatrixXd Hcross;
  MatrixXd *in_stack_00000218;
  size_t i;
  point_t pointsCenter2;
  point_t pointsCenter1;
  transformation_t *solution;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffd28;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd30;
  RhsNested in_stack_fffffffffffffd38;
  LhsNested in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd48;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd50;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_108;
  ulong local_70;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_30 [24];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_18;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_10;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd30,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd30,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd28);
  local_70 = 0;
  while( true ) {
    sVar1 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size(local_10);
    if (sVar1 <= local_70) break;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_10,local_70);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_18,local_70);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    local_70 = local_70 + 1;
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::size(local_10);
  this = local_30;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this_00,(unsigned_long *)in_RDI);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffd28);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::size(local_18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this_00,(unsigned_long *)in_RDI);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffd28);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd50,
             (int *)in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  PVar3.m_rhs.m_matrix = in_stack_fffffffffffffd38.m_matrix;
  PVar3.m_lhs = in_stack_fffffffffffffd40;
  local_108 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x0;
  while( true ) {
    other_00 = local_108;
    pMVar2 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::size(local_10);
    if (pMVar2 <= other_00) break;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_10,(size_type)local_108);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this,other_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd30,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffd28);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_18,(size_type)local_108);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this,other_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd30,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffd28);
    other = Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd28
                      );
    PVar3 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                      (in_stack_fffffffffffffd30,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                       in_stack_fffffffffffffd28);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other_00,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)other.m_matrix);
    local_108 = local_108 + 1;
  }
  arun(in_stack_00000218);
  PVar4 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd30,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd28)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (this,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                   *)other_00);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)PVar4.m_lhs,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)PVar4.m_rhs);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x12855dc);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar3.m_lhs,
             (Index)PVar3.m_rhs.m_matrix.m_matrix,(Index)PVar4.m_lhs);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)PVar4.m_lhs,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar4.m_rhs);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar3.m_lhs,
             (Index)PVar3.m_rhs.m_matrix.m_matrix);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)PVar4.m_lhs,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar4.m_rhs);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1285647);
  return (transformation_t *)this_00;
}

Assistant:

opengv::transformation_t
opengv::math::arun_complete(
    const points_t & p1,
    const points_t & p2 )
{
  assert(p1.size() == p2.size());

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < p1.size(); i++ )
  {
    pointsCenter1 += p1[i];
    pointsCenter2 += p2[i];
  }

  pointsCenter1 = pointsCenter1 / p1.size();
  pointsCenter2 = pointsCenter2 / p2.size();

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < p1.size(); i++ )
  {
    Eigen::Vector3d f = p1[i] - pointsCenter1;
    Eigen::Vector3d fprime = p2[i] - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}